

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O2

int arkStep_StageSetup(ARKodeMem ark_mem,int implicit)

{
  uint uVar1;
  ARKodeARKStepMem step_mem;
  N_Vector *X;
  N_Vector x;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  realtype *c;
  realtype rVar6;
  double s;
  int local_3c;
  realtype *local_38;
  
  step_mem = (ARKodeARKStepMem)ark_mem->step_mem;
  if (step_mem == (ARKodeARKStepMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::ARKStep","arkStep_StageSetup",
                    "Time step module memory is NULL.");
    return -0x15;
  }
  uVar1 = step_mem->istage;
  if (implicit == 0 && uVar1 == 0) {
LAB_003a91c0:
    N_VConst(0.0,step_mem->sdata);
LAB_003a91cd:
    iVar2 = 0;
  }
  else {
    c = step_mem->cvals;
    X = step_mem->Xvecs;
    if (implicit == 0) {
      local_3c = 0;
      iVar2 = 0;
    }
    else {
      s = ark_mem->h * step_mem->Bi->A[(int)uVar1][(int)uVar1];
      step_mem->gamma = s;
      if (ark_mem->firststage == 0) {
        rVar6 = s / step_mem->gammap;
      }
      else {
        step_mem->gammap = s;
        rVar6 = 1.0;
      }
      step_mem->gamrat = rVar6;
      if (step_mem->predictor == 5) {
        if (step_mem->impforcing == 0) goto LAB_003a91c0;
        local_3c = 0;
        arkStep_ApplyForcing(step_mem,ark_mem->tcur,s,&local_3c);
        iVar2 = N_VLinearCombination(local_3c,c,X,step_mem->sdata);
        if (iVar2 != 0) {
          return -0x1c;
        }
        goto LAB_003a91cd;
      }
      N_VLinearSum(1.0,ark_mem->yn,-1.0,step_mem->zpred,step_mem->sdata);
      *c = 1.0;
      x = step_mem->sdata;
      *X = x;
      local_3c = 1;
      iVar2 = 1;
      local_38 = c;
      if (step_mem->mass_type == 1) {
        N_VScale(1.0,x,ark_mem->tempv1);
        iVar3 = (*step_mem->mmult)(ark_mem,ark_mem->tempv1,step_mem->sdata);
        c = local_38;
        if (iVar3 != 0) {
          return -0x12;
        }
      }
    }
    if (step_mem->explicit != 0) {
      uVar4 = 0;
      uVar5 = 0;
      if (0 < (int)uVar1) {
        uVar5 = (ulong)uVar1;
      }
      for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
        *(double *)((long)c + uVar4 * 8 + (ulong)(uint)(iVar2 << 3)) =
             ark_mem->h * step_mem->Be->A[(int)uVar1][uVar4];
        *(N_Vector *)((long)X + uVar4 * 8 + (ulong)(uint)(iVar2 << 3)) = step_mem->Fe[uVar4];
      }
      iVar2 = iVar2 + (int)uVar4;
      local_3c = iVar2;
    }
    if (step_mem->implicit != 0) {
      uVar5 = 0;
      uVar4 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar4 = uVar5;
      }
      for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        c[(long)iVar2 + uVar5] = ark_mem->h * step_mem->Bi->A[(int)uVar1][uVar5];
        X[(long)iVar2 + uVar5] = step_mem->Fi[uVar5];
      }
      iVar2 = iVar2 + (int)uVar5;
      local_3c = iVar2;
    }
    if (step_mem->impforcing != 0) {
      arkStep_ApplyForcing
                (step_mem,ark_mem->tcur,ark_mem->h * step_mem->Bi->A[(int)uVar1][(int)uVar1],
                 &local_3c);
      iVar2 = local_3c;
    }
    iVar3 = N_VLinearCombination(iVar2,c,X,step_mem->sdata);
    iVar2 = -0x1c;
    if (iVar3 == 0) {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int arkStep_StageSetup(ARKodeMem ark_mem, booleantype implicit)
{
  /* local data */
  ARKodeARKStepMem step_mem;
  int retval, i, j, nvec;
  realtype* cvals;
  N_Vector* Xvecs;

  /* access ARKodeARKStepMem structure */
  if (ark_mem->step_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::ARKStep",
                    "arkStep_StageSetup", MSG_ARKSTEP_NO_MEM);
    return(ARK_MEM_NULL);
  }
  step_mem = (ARKodeARKStepMem) ark_mem->step_mem;

  /* Set shortcut to current stage index */
  i = step_mem->istage;

  /* If this is the first stage, and explicit, just set sdata=0 and return */
  if (!implicit && (i==0)) {
    N_VConst(ZERO, step_mem->sdata);
    return (ARK_SUCCESS);
  }

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* Update gamma if stage is implicit */
  if (implicit) {
    step_mem->gamma = ark_mem->h * step_mem->Bi->A[i][i];
    if (ark_mem->firststage)
      step_mem->gammap = step_mem->gamma;
    step_mem->gamrat = (ark_mem->firststage) ?
      ONE : step_mem->gamma / step_mem->gammap;  /* protect x/x != 1.0 */
  }

  /* If predictor==5, then sdata=0 (plus any implicit forcing).
     Set sdata appropriately and return */
  if (implicit && (step_mem->predictor == 5)) {

    /* apply external polynomial forcing (updates nvec, cvals, Xvecs) */
    if (step_mem->impforcing) {
      nvec = 0;
      arkStep_ApplyForcing(step_mem, ark_mem->tcur, step_mem->gamma, &nvec);
      retval = N_VLinearCombination(nvec, cvals, Xvecs, step_mem->sdata);
      if (retval != 0) return(ARK_VECTOROP_ERR);
    } else {
      N_VConst(ZERO, step_mem->sdata);
    }
    return (ARK_SUCCESS);

  }

  /* If implicit, initialize sdata to yn - zpred (here: zpred = zp), and set
     first entries for eventual N_VLinearCombination call */
  nvec = 0;
  if (implicit) {
    N_VLinearSum(ONE, ark_mem->yn, -ONE, step_mem->zpred, step_mem->sdata);
    cvals[0] = ONE;
    Xvecs[0] = step_mem->sdata;
    nvec = 1;
  }

  /* If implicit with fixed M!=I, update sdata with M*sdata */
  if (implicit && (step_mem->mass_type == MASS_FIXED)) {
    N_VScale(ONE, step_mem->sdata, ark_mem->tempv1);
    retval = step_mem->mmult((void *) ark_mem, ark_mem->tempv1, step_mem->sdata);
    if (retval != ARK_SUCCESS)  return (ARK_MASSMULT_FAIL);
  }

  /* Update sdata with prior stage information */
  if (step_mem->explicit) {   /* Explicit pieces */
    for (j=0; j<i; j++) {
      cvals[nvec] = ark_mem->h * step_mem->Be->A[i][j];
      Xvecs[nvec] = step_mem->Fe[j];
      nvec += 1;
    }
  }
  if (step_mem->implicit) {   /* Implicit pieces */
    for (j=0; j<i; j++) {
      cvals[nvec] = ark_mem->h * step_mem->Bi->A[i][j];
      Xvecs[nvec] = step_mem->Fi[j];
      nvec += 1;
    }
  }

  /* apply external polynomial forcing (updates nvec, cvals, Xvecs) */
  if (step_mem->impforcing) {
    arkStep_ApplyForcing(step_mem, ark_mem->tcur,
                         ark_mem->h * step_mem->Bi->A[i][i], &nvec);
  }

  /* call fused vector operation to do the work */
  retval = N_VLinearCombination(nvec, cvals, Xvecs, step_mem->sdata);
  if (retval != 0) return(ARK_VECTOROP_ERR);

  /* return with success */
  return (ARK_SUCCESS);
}